

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::update(FileServer *this)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  undefined8 *puVar4;
  long lVar5;
  size_t __n;
  Communicator *this_00;
  bool bVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  ulong uVar12;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var13;
  int __flags;
  undefined8 in_R8;
  ulong uVar14;
  long lVar15;
  value_type *req;
  pthread_mutex_t *__mutex;
  uint uVar16;
  bool bVar17;
  SerializationBuffer buffer;
  size_t offset;
  FileChunkResponseData fileChunkToSend;
  TAddress local_d8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  FileServer *local_98;
  Serialize local_90;
  size_t local_88;
  undefined1 local_80 [40];
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  long lStack_40;
  ulong local_38;
  
  local_80._0_8_ = local_80 + 0x10;
  local_80._8_8_ = 0;
  local_80[0x10] = '\0';
  local_80._32_4_ = 0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  lStack_40 = 0;
  local_38 = 0;
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar8 = pthread_mutex_lock(__mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  _Var13._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  if ((_Var13._M_head_impl)->changedFileInfos == true) {
    Impl::updateFileInfos(_Var13._M_head_impl);
    _Var13._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    (_Var13._M_head_impl)->changedFileInfos = false;
  }
  if ((_Var13._M_head_impl)->changedClientInfos == true) {
    Impl::updateClientInfos(_Var13._M_head_impl);
    _Var13._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    (_Var13._M_head_impl)->changedClientInfos = false;
  }
  __flags = (int)in_R8;
  uVar12 = (ulong)(_Var13._M_head_impl)->currentClientUpdateId;
  iVar8 = (_Var13._M_head_impl)->currentClientUpdateId + 1;
  (_Var13._M_head_impl)->currentClientUpdateId = iVar8;
  lVar15 = *(long *)&((_Var13._M_head_impl)->clients).
                     super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>.
                     _M_impl.super__Vector_impl_data;
  uVar10 = ((long)*(pointer *)
                   ((long)&((_Var13._M_head_impl)->clients).
                           super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>
                           ._M_impl + 8) - lVar15 >> 3) * -0x30c30c30c30c30c3;
  if (iVar8 == (int)uVar10) {
    (_Var13._M_head_impl)->currentClientUpdateId = 0;
  }
  if (uVar10 < uVar12 || uVar10 - uVar12 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  else {
    lVar9 = uVar12 * 0xa8;
    bVar1 = *(byte *)(lVar15 + 0x40 + lVar9);
    if (bVar1 != 0) {
LAB_0010ccd3:
      pthread_mutex_unlock(__mutex);
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,CONCAT71(local_80._17_7_,local_80[0x10]) + 1);
      }
      return (bool)(bVar1 ^ 1);
    }
    lVar15 = lVar15 + lVar9;
    bVar2 = (_Var13._M_head_impl)->isListening;
    cVar3 = *(char *)(lVar15 + 0x42);
    *(undefined1 *)(lVar15 + 0x42) = 0;
    puVar4 = *(undefined8 **)(lVar15 + 0x58);
    local_b0 = uVar12;
    local_a8 = lVar9;
    if ((*(long *)(lVar15 + 0x78) - *(long *)(lVar15 + 0x80) >> 4) * -0x5555555555555555 +
        ((*(long *)(lVar15 + 0x90) - *(long *)(lVar15 + 0x70) >> 3) + -1 +
        (ulong)(*(long *)(lVar15 + 0x90) == 0)) * 10 ==
        (*(long *)(lVar15 + 0x68) - (long)puVar4 >> 4) * 0x5555555555555555) {
      bVar17 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_80);
      __flags = (int)in_R8;
      local_80._32_4_ = *(undefined4 *)(puVar4 + 4);
      _Var13._M_head_impl =
           (this->m_impl)._M_t.
           super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
           .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
      lVar9 = *(long *)&((_Var13._M_head_impl)->files).
                        super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
      ;
      uVar16 = (int)((long)*(pointer *)((long)&(_Var13._M_head_impl)->files + 8) - lVar9 >> 3) *
               -0x3b13b13b;
      local_98 = this;
      if ((int)uVar16 < 1) {
        bVar17 = false;
      }
      else {
        lVar5 = *(long *)&((_Var13._M_head_impl)->fileUsed).
                          super__Bvector_base<std::allocator<bool>_>;
        uVar12 = (ulong)(uVar16 & 0x7fffffff);
        plVar11 = (long *)(lVar9 + 0x58);
        bVar17 = true;
        uVar10 = 0;
        local_a0 = (long)(int)local_80._32_4_;
        do {
          if ((((*(ulong *)(lVar5 + (uVar10 >> 6 & 0x3ffffff) * 8) >> (uVar10 & 0x3f) & 1) != 0) &&
              (__n = plVar11[-10], __n == puVar4[1])) &&
             ((__n == 0 || (iVar8 = bcmp((void *)plVar11[-0xb],(void *)*puVar4,__n), iVar8 == 0))))
          {
            uVar12 = *plVar11 - plVar11[-1];
            uVar14 = (ulong)(int)plVar11[-2];
            uVar10 = uVar12 / uVar14;
            lStack_40 = local_a0 * uVar10;
            local_38 = uVar12 - lStack_40;
            if ((int)local_a0 != (int)plVar11[-2] + -1) {
              local_38 = uVar10;
            }
            lVar9 = lStack_40 + plVar11[-1];
            std::vector<char,std::allocator<char>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                      ((vector<char,std::allocator<char>> *)&local_58,lVar9,local_38 + lVar9);
            __flags = (int)uVar14;
            break;
          }
          __flags = (int)in_R8;
          uVar10 = uVar10 + 1;
          bVar17 = uVar10 < uVar12;
          plVar11 = plVar11 + 0xd;
        } while (uVar12 != uVar10);
      }
      std::
      deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
      ::pop_front((deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
                   *)(lVar15 + 0x48));
      this = local_98;
    }
    lVar9 = local_a8;
    *(undefined1 *)(lVar15 + 0x40) = 1;
    cVar7 = *(char *)(lVar15 + 0x43);
    if (cVar7 == '\x01') {
      bVar6 = Communicator::isConnected(*(Communicator **)(lVar15 + 0x98));
      if (!bVar6) {
        printf("Client %d has disconnected\n",local_b0);
        *(undefined1 *)(lVar15 + 0x43) = 0;
        Impl::updateClientInfos
                  ((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl);
      }
      cVar7 = *(char *)(lVar15 + 0x43);
    }
    if ((cVar7 == '\0') &&
       (bVar6 = Communicator::isConnected(*(Communicator **)(lVar15 + 0x98)), bVar6)) {
      printf("Client %d has connected\n",local_b0);
      *(undefined1 *)(lVar15 + 0x43) = 1;
      Communicator::getPeerAddress_abi_cxx11_(&local_d8,*(Communicator **)(lVar15 + 0x98));
      std::__cxx11::string::operator=((string *)(lVar15 + 8),(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      Impl::updateClientInfos
                ((this->m_impl)._M_t.
                 super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                 .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl);
      lVar9 = local_a8;
    }
    pthread_mutex_unlock(__mutex);
    _Var13._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    lVar15 = *(long *)&((_Var13._M_head_impl)->clients).
                       super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>;
    uVar10 = ((long)*(pointer *)((long)&(_Var13._M_head_impl)->clients + 8) - lVar15 >> 3) *
             -0x30c30c30c30c30c3;
    if (local_b0 <= uVar10 && uVar10 - local_b0 != 0) {
      this_00 = *(Communicator **)(lVar15 + 0x98 + lVar9);
      if (bVar2 == false) {
        Communicator::stopListening(this_00);
      }
      else {
        Communicator::listen(this_00,*(TPort *)((long)&(_Var13._M_head_impl)->parameters + 0x10),0);
      }
      lVar15 = lVar15 + lVar9;
      if (cVar3 != '\0') {
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity = 0;
        local_90.nBytesProcessed = 0;
        local_88 = 0;
        Serialize::operator()
                  (&local_90,
                   &((this->m_impl)._M_t.
                     super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                     .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                    fileInfos,(SerializationBuffer *)&local_d8,&local_88);
        Communicator::send(*(Communicator **)(lVar15 + 0x98),0x65,local_d8._M_dataplus._M_p,
                           (ulong)(uint)((int)local_d8._M_string_length -
                                        (int)local_d8._M_dataplus._M_p),__flags);
        Communicator::update(*(Communicator **)(lVar15 + 0x98));
        if (local_d8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_d8._M_dataplus._M_p,
                          local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
        }
      }
      if (bVar17) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity = 0;
        local_90.nBytesProcessed = 0;
        local_88 = 0;
        Serialize::operator()
                  (&local_90,(FileChunkResponseData *)local_80,(SerializationBuffer *)&local_d8,
                   &local_88);
        Communicator::send(*(Communicator **)(lVar15 + 0x98),0x67,local_d8._M_dataplus._M_p,
                           (ulong)(uint)((int)local_d8._M_string_length -
                                        (int)local_d8._M_dataplus._M_p),__flags);
        Communicator::update(*(Communicator **)(lVar15 + 0x98));
        if (local_d8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_d8._M_dataplus._M_p,
                          local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
        }
      }
      Communicator::update(*(Communicator **)(lVar15 + 0x98));
      __mutex = (pthread_mutex_t *)
                &((this->m_impl)._M_t.
                  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
      iVar8 = pthread_mutex_lock(__mutex);
      if (iVar8 == 0) {
        *(undefined1 *)
         (*(long *)&(((this->m_impl)._M_t.
                      super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                      .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                    clients).
                    super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> +
          0x40 + lVar9) = 0;
        goto LAB_0010ccd3;
      }
      goto LAB_0010cd4a;
    }
  }
  iVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010cd4a:
  std::__throw_system_error(iVar8);
}

Assistant:

bool FileServer::update() {
    bool doListen = false;
    bool doSendFileInfos = false;
    bool doSendFileChunk = false;

    FileChunkResponseData fileChunkToSend;

    TClientId updateId = -1;

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (m_impl->changedFileInfos) {
            m_impl->updateFileInfos();
            m_impl->changedFileInfos = false;
        }

        if (m_impl->changedClientInfos) {
            m_impl->updateClientInfos();
            m_impl->changedClientInfos = false;
        }

        updateId = m_impl->currentClientUpdateId;

        if (++m_impl->currentClientUpdateId == (int) m_impl->clients.size()) {
            m_impl->currentClientUpdateId = 0;
        }

        auto & client = m_impl->clients.at(updateId);

        if (client.isUpdating) {
            return false;
        }

        doListen = m_impl->isListening;

        doSendFileInfos = client.sendFileInfos;
        client.sendFileInfos = false;

        if (client.fileChunkRequests.size() > 0) {
            const auto & req = client.fileChunkRequests.front();

            // todo : data checks
            fileChunkToSend.uri = req.uri;
            fileChunkToSend.chunkId = req.chunkId;
            for (int i = 0; i < (int) m_impl->files.size(); ++i) {
                if (m_impl->fileUsed[i] == false) {
                    continue;
                }

                const auto & file = m_impl->files[i];
                if (file.info.uri != req.uri) {
                    continue;
                }

                auto chunkSize = file.data.size()/file.info.nChunks;

                int64_t pStart = req.chunkId*chunkSize;
                int64_t pLen = req.chunkId == (file.info.nChunks - 1) ? file.data.size() - pStart : chunkSize;

                fileChunkToSend.pStart = pStart;
                fileChunkToSend.pLen = pLen;
                fileChunkToSend.data.assign(file.data.begin() + pStart, file.data.begin() + pStart + pLen);

                doSendFileChunk = true;

                break;
            }

            client.fileChunkRequests.pop_front();
        }

        client.isUpdating = true;

        if (client.wasConnected && client.communicator->isConnected() == false) {
            printf("Client %d has disconnected\n", updateId);
            client.wasConnected = false;
            m_impl->updateClientInfos();
        }

        if (client.wasConnected == false && client.communicator->isConnected()) {
            printf("Client %d has connected\n", updateId);
            client.wasConnected = true;
            client.info.address = client.communicator->getPeerAddress();
            m_impl->updateClientInfos();
        }
    }

    {
        auto & client = m_impl->clients.at(updateId);
        if (doListen) {
            client.communicator->listen(m_impl->parameters.listenPort, 0);
        } else {
            client.communicator->stopListening();
        }
        if (doSendFileInfos) {
            SerializationBuffer buffer;
            Serialize()(m_impl->fileInfos, buffer);
            client.communicator->send(MsgFileInfosResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        if (doSendFileChunk) {
            SerializationBuffer buffer;
            Serialize()(fileChunkToSend, buffer);
            client.communicator->send(MsgFileChunkResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        client.communicator->update();
    }

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        m_impl->clients[updateId].isUpdating = false;
    }

    return true;
}